

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O1

void cfg_help_int(autobuf *out,int64_t min,int64_t max,uint16_t bytelen,uint16_t fraction)

{
  ulong uVar1;
  byte bVar2;
  undefined6 in_register_0000000a;
  undefined8 uVar3;
  isonumber_str *piVar4;
  ulong uVar5;
  char *fmt;
  undefined6 in_register_00000082;
  uint64_t scaling;
  isonumber_str hbuf2;
  isonumber_str hbuf1;
  isonumber_str local_90;
  isonumber_str local_60;
  
  uVar3 = CONCAT62(in_register_0000000a,bytelen);
  uVar1 = CONCAT62(in_register_00000082,fraction) & 0xffffffff;
  bVar2 = (char)bytelen * -8;
  uVar5 = 0x7fffffffffffffff >> (bVar2 & 0x3f);
  if ((int)CONCAT62(in_register_00000082,fraction) == 0) {
    scaling = 1;
  }
  else {
    scaling = 1;
    do {
      scaling = scaling * 10;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  isonumber_from_s64(&local_60,min,"",scaling,true);
  isonumber_from_s64(&local_90,max,"",scaling,true);
  if (-0x8000000000000000 >> (bVar2 & 0x3f) < min) {
    if (max < (long)uVar5) {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte fractional integer between %s and %s with a maximum of %d fractional digits"
                 ,uVar3,&local_60,&local_90);
      return;
    }
    fmt = 
    "    Parameter must be a %d-byte fractional integer larger or equal than %s with a maximum of %d fractional digits"
    ;
    piVar4 = &local_60;
  }
  else {
    if ((long)uVar5 <= max) {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte signed integer with a maximum of %d fractional digits"
                 ,uVar3,fraction);
      return;
    }
    fmt = 
    "    Parameter must be a %d-byte fractional integer smaller or equal than %s with a maximum of %d fractional digits"
    ;
    piVar4 = &local_90;
  }
  cfg_append_printable_line(out,fmt,uVar3,piVar4,fraction);
  return;
}

Assistant:

void
cfg_help_int(struct autobuf *out, int64_t min, int64_t max, uint16_t bytelen, uint16_t fraction) {
  struct isonumber_str hbuf1, hbuf2;
  int64_t min64, max64;
  uint64_t j, scaling;

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  /* get string representation of min/max */
  isonumber_from_s64(&hbuf1, min, "", scaling, true);
  isonumber_from_s64(&hbuf2, max, "", scaling, true);

  if (min > min64) {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " between %s and %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " larger or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, fraction );
    }
  }
  else {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " smaller or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte signed integer"
                               " with a maximum of %d fractional digits",
        bytelen, fraction );
    }
  }
}